

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

void xmlSAX2StartElement(void *ctx,xmlChar *fullname,xmlChar **atts)

{
  xmlDocPtr doc;
  _xmlNode *p_Var1;
  xmlDtdPtr dtd;
  _xmlDtd *p_Var2;
  int iVar3;
  uint uVar4;
  xmlNodePtr pxVar5;
  _xmlNode *attr;
  xmlChar *content;
  xmlChar *pxVar6;
  xmlElementPtr pxVar7;
  xmlAttributePtr pxVar8;
  xmlNsPtr *fullname_00;
  xmlNodePtr pxVar9;
  xmlAttributePtr *ppxVar10;
  xmlAttributePtr pxVar11;
  xmlChar **ppxVar12;
  xmlChar *local_98;
  xmlValidCtxtPtr local_90;
  uint local_84;
  xmlNodePtr local_80;
  xmlNodePtr local_78;
  xmlChar *local_70;
  xmlNsPtr ns;
  
  if (fullname == (xmlChar *)0x0 || ctx == (void *)0x0) {
    return;
  }
  doc = *(xmlDocPtr *)((long)ctx + 0x10);
  if (doc == (xmlDocPtr)0x0) {
    return;
  }
  if (*(int *)((long)ctx + 0x34) != 0) {
    pxVar5 = xmlNewDocNode(doc,(xmlNsPtr)0x0,fullname,(xmlChar *)0x0);
    if (pxVar5 == (xmlNodePtr)0x0) {
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      return;
    }
    *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
    xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,pxVar5);
    iVar3 = nodePush((xmlParserCtxtPtr)ctx,pxVar5);
    if (iVar3 < 0) {
      xmlUnlinkNode(pxVar5);
      xmlFreeNode(pxVar5);
      return;
    }
    if (atts == (xmlChar **)0x0) {
      return;
    }
    local_90 = (xmlValidCtxtPtr)((long)ctx + 0xa0);
    do {
      pxVar6 = *atts;
      if (pxVar6 == (xmlChar *)0x0) {
        return;
      }
      content = atts[1];
      attr = (_xmlNode *)
             xmlNewNsProp(*(xmlNodePtr *)((long)ctx + 0x50),(xmlNsPtr)0x0,pxVar6,(xmlChar *)0x0);
      if (attr == (_xmlNode *)0x0) {
LAB_00145542:
        xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      }
      else {
        if (content == (xmlChar *)0x0) {
          iVar3 = htmlIsBooleanAttr(pxVar6);
          if (iVar3 != 0) {
            content = xmlStrdup(pxVar6);
            pxVar6 = content;
            if (content == (xmlChar *)0x0) goto LAB_00145542;
            goto LAB_00145502;
          }
          pxVar6 = (xmlChar *)0x0;
        }
        else {
          pxVar6 = (xmlChar *)0x0;
LAB_00145502:
          pxVar5 = xmlNewDocText(*(xmlDoc **)((long)ctx + 0x10),content);
          attr->children = pxVar5;
          if (pxVar5 == (xmlNodePtr)0x0) {
            xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
          }
          else {
            attr->last = pxVar5;
            pxVar5->parent = attr;
          }
        }
        if (((((*(byte *)((long)ctx + 0x1b0) & 8) == 0) &&
             (p_Var1 = attr->children, p_Var1 != (_xmlNode *)0x0)) &&
            (p_Var1->type == XML_TEXT_NODE)) && (p_Var1->next == (_xmlNode *)0x0)) {
          iVar3 = xmlIsID(*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                          (xmlAttrPtr)attr);
          if (iVar3 < 0) {
            xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
          }
          else if (iVar3 != 0) {
            xmlAddID(local_90,*(xmlDocPtr *)((long)ctx + 0x10),attr->children->content,
                     (xmlAttrPtr)attr);
          }
        }
        if (pxVar6 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar6);
        }
      }
      atts = atts + 2;
    } while( true );
  }
  if (((*(int *)((long)ctx + 0x9c) != 0) && (doc->extSubset == (_xmlDtd *)0x0)) &&
     ((p_Var2 = doc->intSubset, p_Var2 == (_xmlDtd *)0x0 ||
      (((p_Var2->notations == (void *)0x0 && (p_Var2->elements == (void *)0x0)) &&
       ((p_Var2->attributes == (void *)0x0 && (p_Var2->entities == (void *)0x0)))))))) {
    xmlErrValid((xmlParserCtxtPtr)ctx,XML_ERR_NO_DTD,"Validation failed: no DTD found !",
                (xmlChar *)0x0,(xmlChar *)0x0);
    *(undefined4 *)((long)ctx + 0x9c) = 0;
  }
  pxVar6 = xmlSplitQName4(fullname,&local_98);
  if (pxVar6 == (xmlChar *)0x0) {
LAB_001459cd:
    xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
    return;
  }
  pxVar5 = xmlNewDocNode(*(xmlDocPtr *)((long)ctx + 0x10),(xmlNsPtr)0x0,pxVar6,(xmlChar *)0x0);
  if (pxVar5 == (xmlNodePtr)0x0) {
    (*xmlFree)(local_98);
    goto LAB_001459cd;
  }
  *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
  pxVar9 = *(xmlNodePtr *)((long)ctx + 0x50);
  if (pxVar9 == (xmlNodePtr)0x0) {
    pxVar9 = *(xmlNodePtr *)((long)ctx + 0x10);
  }
  xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,pxVar5);
  iVar3 = nodePush((xmlParserCtxtPtr)ctx,pxVar5);
  if (iVar3 < 0) {
    xmlUnlinkNode(pxVar5);
    xmlFreeNode(pxVar5);
    goto LAB_00145baf;
  }
  dtd = *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50);
  local_80 = pxVar9;
  local_78 = pxVar5;
  if ((dtd != (xmlDtdPtr)0x0) || (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0)) {
    local_90 = (xmlValidCtxtPtr)local_98;
    pxVar7 = xmlGetDtdQElementDesc(dtd,pxVar6,local_98);
    local_84 = (uint)CONCAT71((int7)((ulong)pxVar7 >> 8),pxVar7 != (xmlElementPtr)0x0);
    local_70 = pxVar6;
    if (pxVar7 == (xmlElementPtr)0x0) {
      pxVar7 = xmlGetDtdQElementDesc
                         (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),pxVar6,
                          (xmlChar *)local_90);
    }
    while (pxVar7 != (xmlElementPtr)0x0) {
      if (((*(int *)(*(long *)((long)ctx + 0x10) + 0x4c) == 1) &&
          (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0)) && (*(int *)((long)ctx + 0x9c) != 0)
         ) {
        for (pxVar11 = pxVar7->attributes; pxVar11 != (xmlAttributePtr)0x0; pxVar11 = pxVar11->nexth
            ) {
          if (((pxVar11->defaultValue != (xmlChar *)0x0) &&
              (pxVar8 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),
                                           pxVar11->elem,pxVar11->name,pxVar11->prefix),
              pxVar8 == pxVar11)) &&
             (pxVar8 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50),
                                          pxVar11->elem,pxVar11->name,pxVar11->prefix),
             pxVar8 == (xmlAttributePtr)0x0)) {
            if (pxVar11->prefix == (xmlChar *)0x0) {
              pxVar6 = xmlStrdup(pxVar11->name);
LAB_00145779:
              if (pxVar6 != (xmlChar *)0x0) {
                ppxVar12 = atts;
                if (atts == (xmlChar **)0x0) {
LAB_001457a3:
                  xmlErrValid((xmlParserCtxtPtr)ctx,XML_DTD_STANDALONE_DEFAULTED,
                              "standalone: attribute %s on %s defaulted from external subset\n",
                              pxVar6,pxVar11->elem);
                }
                else {
                  do {
                    if (*ppxVar12 == (xmlChar *)0x0) goto LAB_001457a3;
                    iVar3 = xmlStrEqual(*ppxVar12,pxVar6);
                    ppxVar12 = ppxVar12 + 2;
                  } while (iVar3 == 0);
                }
                (*xmlFree)(pxVar6);
                goto LAB_001457d4;
              }
            }
            else {
              pxVar6 = xmlStrdup(pxVar11->prefix);
              if ((pxVar6 != (xmlChar *)0x0) &&
                 (pxVar6 = xmlStrcat(pxVar6,":"), pxVar6 != (xmlChar *)0x0)) {
                pxVar6 = xmlStrcat(pxVar6,pxVar11->name);
                goto LAB_00145779;
              }
            }
            xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
            break;
          }
LAB_001457d4:
        }
      }
      pxVar6 = local_70;
      ppxVar10 = &pxVar7->attributes;
      while (pxVar11 = *ppxVar10, pxVar11 != (xmlAttributePtr)0x0) {
        if (pxVar11->defaultValue != (xmlChar *)0x0) {
          if (pxVar11->prefix == (xmlChar *)0x0) {
LAB_0014582c:
            iVar3 = xmlStrEqual(pxVar11->name,"xmlns");
            if (iVar3 == 0) {
LAB_0014583d:
              if ((*(byte *)((long)ctx + 0x1b0) & 4) == 0) goto LAB_001458fb;
            }
          }
          else {
            iVar3 = xmlStrEqual(pxVar11->prefix,"xmlns");
            if (iVar3 == 0) {
              if (pxVar11->prefix == (xmlChar *)0x0) goto LAB_0014582c;
              goto LAB_0014583d;
            }
          }
          pxVar8 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50),
                                      pxVar11->elem,pxVar11->name,pxVar11->prefix);
          if (pxVar8 == pxVar11 || pxVar8 == (xmlAttributePtr)0x0) {
            fullname_00 = (xmlNsPtr *)
                          xmlBuildQName(pxVar11->name,pxVar11->prefix,(xmlChar *)&ns,0x32);
            if (fullname_00 == (xmlNsPtr *)0x0) {
              xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
              goto LAB_001459e2;
            }
            ppxVar12 = atts;
            if (atts == (xmlChar **)0x0) {
LAB_001458bf:
              xmlSAX1Attribute((xmlParserCtxtPtr)ctx,(xmlChar *)fullname_00,pxVar11->defaultValue,
                               (xmlChar *)local_90);
            }
            else {
              do {
                if (*ppxVar12 == (xmlChar *)0x0) goto LAB_001458bf;
                iVar3 = xmlStrEqual(*ppxVar12,(xmlChar *)fullname_00);
                ppxVar12 = ppxVar12 + 2;
              } while (iVar3 == 0);
            }
            if ((fullname_00 != &ns) && (fullname_00 != (xmlNsPtr *)pxVar11->name)) {
              (*xmlFree)(fullname_00);
            }
          }
        }
LAB_001458fb:
        ppxVar10 = &pxVar11->nexth;
      }
      if ((local_84 & 1) == 0) break;
      pxVar7 = xmlGetDtdQElementDesc
                         (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),pxVar6,
                          (xmlChar *)local_90);
      local_84 = 0;
    }
  }
LAB_001459e2:
  pxVar5 = local_80;
  if (atts != (xmlChar **)0x0) {
    for (ppxVar12 = atts + 1;
        (pxVar6 = ppxVar12[-1], pxVar6 != (xmlChar *)0x0 && (*ppxVar12 != (xmlChar *)0x0));
        ppxVar12 = ppxVar12 + 2) {
      if ((*pxVar6 == 'x') &&
         ((((pxVar6[1] == 'm' && (pxVar6[2] == 'l')) && (pxVar6[3] == 'n')) && (pxVar6[4] == 's'))))
      {
        xmlSAX1Attribute((xmlParserCtxtPtr)ctx,pxVar6,*ppxVar12,local_98);
      }
    }
  }
  pxVar9 = local_78;
  iVar3 = xmlSearchNsSafe(local_78,local_98,&ns);
  if (iVar3 < 0) {
    xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
  }
  if ((pxVar5 != (xmlNodePtr)0x0 && ns == (xmlNsPtr)0x0) &&
     (iVar3 = xmlSearchNsSafe(pxVar5,local_98,&ns), iVar3 < 0)) {
    xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
  }
  if (ns == (xmlNsPtr)0x0 && local_98 != (xmlChar *)0x0) {
    xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_UNDEFINED_NAMESPACE,
                 "Namespace prefix %s is not defined\n",local_98,(xmlChar *)0x0);
    ns = xmlNewNs(pxVar9,(xmlChar *)0x0,local_98);
    if (ns == (xmlNsPtr)0x0) {
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      goto LAB_00145ae0;
    }
LAB_00145ae5:
    if ((ns->href != (xmlChar *)0x0) && ((*ns->href != '\0' || (ns->prefix != (xmlChar *)0x0)))) {
      xmlSetNs(pxVar9,ns);
    }
  }
  else {
LAB_00145ae0:
    if (ns != (xmlNsPtr)0x0) goto LAB_00145ae5;
  }
  if (atts != (xmlChar **)0x0) {
    for (ppxVar12 = atts + 1;
        (pxVar6 = ppxVar12[-1], pxVar6 != (xmlChar *)0x0 && (*ppxVar12 != (xmlChar *)0x0));
        ppxVar12 = ppxVar12 + 2) {
      if (((*pxVar6 != 'x') || (((pxVar6[1] != 'm' || (pxVar6[2] != 'l')) || (pxVar6[3] != 'n'))))
         || (pxVar6[4] != 's')) {
        xmlSAX1Attribute((xmlParserCtxtPtr)ctx,pxVar6,*ppxVar12,(xmlChar *)0x0);
      }
    }
  }
  if ((*(int *)((long)ctx + 0x9c) != 0) && ((*(byte *)((long)ctx + 0xd0) & 1) == 0)) {
    iVar3 = xmlValidateDtdFinal((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10)
                               );
    if ((iVar3 < 1) && (*(undefined4 *)((long)ctx + 0x98) = 0, iVar3 < 0)) {
      *(undefined4 *)((long)ctx + 0x18) = 0;
    }
    uVar4 = xmlValidateRoot((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10));
    *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar4;
    *(byte *)((long)ctx + 0xd0) = *(byte *)((long)ctx + 0xd0) | 1;
  }
LAB_00145baf:
  if (local_98 == (xmlChar *)0x0) {
    return;
  }
  (*xmlFree)(local_98);
  return;
}

Assistant:

void
xmlSAX2StartElement(void *ctx, const xmlChar *fullname, const xmlChar **atts) {
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    (void) atts;

    if ((ctxt == NULL) || (fullname == NULL) || (ctxt->myDoc == NULL))
        return;

#ifdef LIBXML_SAX1_ENABLED
    if (!ctxt->html) {
        xmlSAX1StartElement(ctxt, fullname, atts);
        return;
    }
#endif

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        xmlSAX2StartHtmlElement(ctxt, fullname, atts);
        return;
    }
#endif
}